

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeFactorable(Parse *pParse,Expr *pExpr,int target)

{
  int iVar1;
  
  if (pParse->okConstFactor != '\0') {
    iVar1 = sqlite3ExprIsConstantNotJoin(pExpr);
    if (iVar1 != 0) {
      sqlite3ExprCodeAtInit(pParse,pExpr,target);
      return;
    }
  }
  sqlite3ExprCode(pParse,pExpr,target);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeFactorable(Parse *pParse, Expr *pExpr, int target){
  if( pParse->okConstFactor && sqlite3ExprIsConstantNotJoin(pExpr) ){
    sqlite3ExprCodeAtInit(pParse, pExpr, target);
  }else{
    sqlite3ExprCode(pParse, pExpr, target);
  }
}